

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

void __thiscall amrex::BaseFab<char>::BaseFab(BaseFab<char> *this,Box *bx,int n,Arena *ar)

{
  BaseFab<char> *in_RCX;
  undefined4 in_EDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  
  DataAllocator::DataAllocator((DataAllocator *)(in_RDI + 1),(Arena *)in_RCX);
  *in_RDI = &PTR__BaseFab_01aa4888;
  in_RDI[2] = 0;
  in_RDI[3] = *in_RSI;
  in_RDI[4] = in_RSI[1];
  in_RDI[5] = in_RSI[2];
  *(undefined4 *)(in_RDI + 6) = *(undefined4 *)(in_RSI + 3);
  *(undefined4 *)((long)in_RDI + 0x34) = in_EDX;
  in_RDI[7] = 0;
  *(undefined1 *)(in_RDI + 8) = 0;
  *(undefined1 *)((long)in_RDI + 0x41) = 0;
  define(in_RCX);
  return;
}

Assistant:

BaseFab<T>::BaseFab (const Box& bx, int n, Arena* ar)
    : DataAllocator{ar}, domain(bx), nvar(n)
{
    define();
}